

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O0

uint sf::priv::RenderTextureImplFBO::getMaximumAntialiasingLevel(void)

{
  uint uVar1;
  uint local_10;
  TransientContextLock local_9;
  GLint samples;
  TransientContextLock lock;
  
  GlResource::TransientContextLock::TransientContextLock(&local_9);
  local_10 = 0;
  glGetIntegerv(0x8d57,&local_10);
  glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
               ,0xc5,"glGetIntegerv(GLEXT_GL_MAX_SAMPLES, &samples)");
  uVar1 = local_10;
  GlResource::TransientContextLock::~TransientContextLock(&local_9);
  return uVar1;
}

Assistant:

unsigned int RenderTextureImplFBO::getMaximumAntialiasingLevel()
{
    TransientContextLock lock;

    GLint samples = 0;

#ifndef SFML_OPENGL_ES

    glCheck(glGetIntegerv(GLEXT_GL_MAX_SAMPLES, &samples));

#endif

    return static_cast<unsigned int>(samples);
}